

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseContainer.cpp
# Opt level: O1

void __thiscall
Saturation::ActiveClauseContainer::onLimitsUpdated
          (ActiveClauseContainer *this,PassiveClauseContainer *limits)

{
  uint uVar1;
  Cell *pCVar2;
  Clause *pCVar3;
  int iVar4;
  Cell *pCVar5;
  bool bVar6;
  
  iVar4 = (*(limits->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer
            [0xd])(limits);
  if ((char)iVar4 != '\0') {
    if ((onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove == '\0') &&
       (iVar4 = __cxa_guard_acquire(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove)
       , iVar4 != 0)) {
      onLimitsUpdated::toRemove._capacity = 0x40;
      onLimitsUpdated::toRemove._stack = (Clause **)::operator_new(0x200,0x10);
      onLimitsUpdated::toRemove._end =
           onLimitsUpdated::toRemove._stack + onLimitsUpdated::toRemove._capacity;
      onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._stack;
      __cxa_atexit(::Lib::Stack<Kernel::Clause_*>::~Stack,&onLimitsUpdated::toRemove,&__dso_handle);
      __cxa_guard_release(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove);
    }
    onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._stack;
    pCVar5 = (this->_clauses)._entries;
    pCVar2 = (this->_clauses)._afterLast;
LAB_00685603:
    bVar6 = pCVar5 != pCVar2;
    if (bVar6) {
      bVar6 = true;
      uVar1 = pCVar5->code;
      while (uVar1 < 2) {
        pCVar5 = pCVar5 + 1;
        bVar6 = pCVar5 != pCVar2;
        if (pCVar5 == pCVar2) break;
        uVar1 = pCVar5->code;
      }
    }
    if (bVar6) {
      pCVar3 = pCVar5->value;
      pCVar5 = pCVar5 + 1;
      iVar4 = (*(limits->super_RandomAccessClauseContainer).super_ClauseContainer.
                _vptr_ClauseContainer[0xe])
                        (limits,pCVar3,(ulong)(*(uint *)&pCVar3->field_0x3c & 0xfffff));
      if ((char)iVar4 != '\0') {
        if (onLimitsUpdated::toRemove._cursor == onLimitsUpdated::toRemove._end) {
          ::Lib::Stack<Kernel::Clause_*>::expand(&onLimitsUpdated::toRemove);
        }
        *onLimitsUpdated::toRemove._cursor = pCVar3;
        onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._cursor + 1;
      }
      goto LAB_00685603;
    }
    if (onLimitsUpdated::toRemove._cursor != onLimitsUpdated::toRemove._stack) {
      do {
        pCVar3 = onLimitsUpdated::toRemove._cursor[-1];
        onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._cursor + -1;
        *(int *)(DAT_00b7e1c0 + 0x1e4) = *(int *)(DAT_00b7e1c0 + 0x1e4) + 1;
        (*(this->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[4])
                  (this,pCVar3);
      } while (onLimitsUpdated::toRemove._cursor != onLimitsUpdated::toRemove._stack);
    }
  }
  return;
}

Assistant:

void ActiveClauseContainer::onLimitsUpdated(PassiveClauseContainer* limits)
{
  ASS(limits);
  if (!limits->mayBeAbleToDiscriminateChildrenOnLimits()) {
    return;
  }

  static Stack<Clause*> toRemove(64);
  toRemove.reset();

  auto rit = _clauses.iter();
  while (rit.hasNext()) {
    Clause* cl=rit.next();
    ASS(cl);

    if (limits->allChildrenNecessarilyExceedLimits(cl, cl->numSelected()))
    {
      ASS(cl->store()==Clause::ACTIVE);
      toRemove.push(cl);
    }
  }

#if OUTPUT_LRS_DETAILS
  if (toRemove.isNonEmpty()) {
    cout<<toRemove.size()<<" active deleted\n";
  }
#endif

  while (toRemove.isNonEmpty()) {
    Clause* removed=toRemove.pop();
    ASS(removed->store()==Clause::ACTIVE);

    RSTAT_CTR_INC("clauses discarded from active on limit update");
    env.statistics->discardedNonRedundantClauses++;

    remove(removed);
    // ASS_NEQ(removed->store(), Clause::ACTIVE); -- the remove could have deleted the clause - do not touch!
  }
}